

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * convert_charset(char *in_str,Charset from,Charset to)

{
  size_t sVar1;
  size_t sVar2;
  Charset in_EDX;
  Charset in_ESI;
  char16_t *in_RDI;
  char *out;
  char *str_out;
  char *in;
  size_t n_out;
  size_t type_size;
  size_t length;
  size_t n_in;
  iconv_t conv;
  char *cs_to;
  char *cs_from;
  size_t local_70;
  char *local_68;
  char *local_60;
  char16_t *local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  iconv_t local_30;
  char *local_28;
  char *local_20;
  Charset local_18;
  Charset local_14;
  char16_t *local_10;
  char *local_8;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = charset_string(in_ESI);
  local_28 = charset_string(local_18);
  local_30 = iconv_open(local_28,local_20);
  if (local_30 == (iconv_t)0xffffffffffffffff) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    local_8 = (char *)0x0;
  }
  else {
    if (local_14 == CS_UTF_16LE) {
      sVar1 = strlenU16(local_10);
      local_70 = sVar1 << 1;
    }
    else {
      local_70 = strlen((char *)local_10);
    }
    local_38 = local_70;
    local_48 = 1;
    if (local_18 == CS_UTF_16LE) {
      local_48 = 2;
    }
    local_50 = local_48 * local_70 * 6;
    local_58 = local_10;
    local_40 = local_50;
    local_68 = (char *)malloc(local_50 + local_48);
    local_60 = local_68;
    sVar2 = iconv(local_30,(char **)&local_58,&local_38,&local_68,&local_50);
    if (sVar2 == 0xffffffffffffffff) {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      local_8 = (char *)0x0;
    }
    else {
      local_60[local_40 - local_50] = '\0';
      if (local_48 == 2) {
        local_60[(local_40 - local_50) + 1] = '\0';
      }
      local_8 = local_60;
    }
  }
  return local_8;
}

Assistant:

char *convert_charset(const char *in_str, Charset from, Charset to)
{
	char *cs_from = charset_string(from);
	char *cs_to = charset_string(to);
	iconv_t conv = iconv_open(cs_to, cs_from);
	if (conv == (iconv_t)-1)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	size_t n_in = (from == CS_UTF_16LE) ? strlenU16((char16_t *)in_str) * sizeof(char16_t) : strlen(in_str) * sizeof(char);
	size_t length = n_in * 6;
	size_t type_size = (to == CS_UTF_16LE) ? sizeof(char16_t) : sizeof(char);
	length *= type_size;
	size_t n_out = length;
	char *in = (char *)in_str;
	char *str_out = (char *)malloc(length + type_size);
	char *out = (char *)str_out;
	if (iconv(conv, (char **)&in, &n_in, &out, &n_out) == (size_t)-1)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	str_out[length - n_out] = 0;
	if (type_size == sizeof(char16_t))
	{
		str_out[length - n_out + 1] = 0;
	}
	return str_out;
}